

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_clear(JSON_Object *object)

{
  size_t sVar1;
  ulong local_20;
  size_t i;
  JSON_Object *object_local;
  
  if (object == (JSON_Object *)0x0) {
    object_local._4_4_ = -1;
  }
  else {
    local_20 = 0;
    while( true ) {
      sVar1 = json_object_get_count(object);
      if (sVar1 <= local_20) break;
      (*parson_free)(object->names[local_20]);
      object->names[local_20] = (char *)0x0;
      json_value_free(object->values[local_20]);
      object->values[local_20] = (JSON_Value *)0x0;
      local_20 = local_20 + 1;
    }
    object->count = 0;
    for (local_20 = 0; local_20 < object->cell_capacity; local_20 = local_20 + 1) {
      object->cells[local_20] = 0xffffffffffffffff;
    }
    object_local._4_4_ = 0;
  }
  return object_local._4_4_;
}

Assistant:

JSON_Status json_object_clear(JSON_Object *object) {
    size_t i = 0;
    if (object == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_object_get_count(object); i++) {
        parson_free(object->names[i]);
        object->names[i] = NULL;
        
        json_value_free(object->values[i]);
        object->values[i] = NULL;
    }
    object->count = 0;
    for (i = 0; i < object->cell_capacity; i++) {
        object->cells[i] = OBJECT_INVALID_IX;
    }
    return JSONSuccess;
}